

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observer.hpp
# Opt level: O2

void __thiscall
baryonyx::pnm_observer::pnm_observer(pnm_observer *this,string_view filename,int m,int n,long loop)

{
  details::pi_pnm_observer::pi_pnm_observer(&this->m_pi_obs,filename,m,n,loop);
  details::ap_pnm_observer::ap_pnm_observer(&this->m_ap_obs,filename,m,n,loop);
  return;
}

Assistant:

pnm_observer(const std::string_view filename, int m, int n, long int loop)
      : m_pi_obs(filename, m, n, loop)
      , m_ap_obs(filename, m, n, loop)
    {}